

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTargetPropCommandBase.cxx
# Opt level: O2

bool __thiscall
cmTargetPropCommandBase::PopulateTargetProperies
          (cmTargetPropCommandBase *this,string *scope,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *content,bool prepend,bool system)

{
  bool bVar1;
  int iVar2;
  
  bVar1 = std::operator==(scope,"PRIVATE");
  if (((bVar1) || (bVar1 = std::operator==(scope,"PUBLIC"), bVar1)) &&
     (iVar2 = (*(this->super_cmCommand).super_cmObject._vptr_cmObject[0xf])
                        (this,this->Target,content,(ulong)prepend,(ulong)system),
     (char)iVar2 == '\0')) {
    return false;
  }
  bVar1 = std::operator==(scope,"INTERFACE");
  if ((!bVar1) && (bVar1 = std::operator==(scope,"PUBLIC"), !bVar1)) {
    return true;
  }
  (*(this->super_cmCommand).super_cmObject._vptr_cmObject[0xc])
            (this,this->Target,content,(ulong)prepend,(ulong)system);
  return true;
}

Assistant:

bool cmTargetPropCommandBase
::PopulateTargetProperies(const std::string &scope,
                          const std::vector<std::string> &content,
                          bool prepend, bool system)
{
  if (scope == "PRIVATE" || scope == "PUBLIC")
    {
    if (!this->HandleDirectContent(this->Target, content, prepend, system))
      {
      return false;
      }
    }
  if (scope == "INTERFACE" || scope == "PUBLIC")
    {
    this->HandleInterfaceContent(this->Target, content, prepend, system);
    }
  return true;
}